

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highscore.h
# Opt level: O3

void __thiscall Highscore::Set(Highscore *this,size_t id,size_t score)

{
  Entry *pEVar1;
  __normal_iterator<Highscore::Entry_*,_std::vector<Highscore::Entry,_std::allocator<Highscore::Entry>_>_>
  _Var2;
  Entry *pEVar3;
  Entry *pEVar4;
  Entry *pEVar5;
  
  if (this->mLowestScore <= score) {
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<Highscore::Entry*,std::vector<Highscore::Entry,std::allocator<Highscore::Entry>>>,__gnu_cxx::__ops::_Iter_pred<Highscore::Set(unsigned_long,unsigned_long)::_lambda(Highscore::Entry_const&)_1_>>
                      ((this->mEntries).
                       super__Vector_base<Highscore::Entry,_std::allocator<Highscore::Entry>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (this->mEntries).
                       super__Vector_base<Highscore::Entry,_std::allocator<Highscore::Entry>_>.
                       _M_impl.super__Vector_impl_data._M_finish,id);
    pEVar5 = (this->mEntries).
             super__Vector_base<Highscore::Entry,_std::allocator<Highscore::Entry>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (_Var2._M_current == pEVar5) {
      _Var2 = std::
              __find_if<__gnu_cxx::__normal_iterator<Highscore::Entry*,std::vector<Highscore::Entry,std::allocator<Highscore::Entry>>>,__gnu_cxx::__ops::_Iter_pred<Highscore::Set(unsigned_long,unsigned_long)::_lambda(Highscore::Entry_const&)_2_>>
                        ((this->mEntries).
                         super__Vector_base<Highscore::Entry,_std::allocator<Highscore::Entry>_>.
                         _M_impl.super__Vector_impl_data._M_start,pEVar5,score);
      pEVar5 = (this->mEntries).
               super__Vector_base<Highscore::Entry,_std::allocator<Highscore::Entry>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    if (_Var2._M_current != pEVar5) {
      (_Var2._M_current)->id = id;
      (_Var2._M_current)->score = score;
      pEVar4 = (this->mEntries).
               super__Vector_base<Highscore::Entry,_std::allocator<Highscore::Entry>_>._M_impl.
               super__Vector_impl_data._M_start;
      pEVar3 = pEVar4 + 1;
      if (pEVar3 != pEVar5 && pEVar4 != pEVar5) {
        do {
          pEVar1 = pEVar3;
          if (pEVar4->score <= pEVar3->score) {
            pEVar1 = pEVar4;
          }
          pEVar4 = pEVar1;
          pEVar3 = pEVar3 + 1;
        } while (pEVar3 != pEVar5);
      }
      this->mLowestScore = pEVar4->score;
    }
  }
  return;
}

Assistant:

void Set( const size_t id, const size_t score ) {
    if( score < mLowestScore )
      return;

    auto it = std::find_if(
      mEntries.begin(), mEntries.end(),
      [id]( const Entry& candidate ) { return id == candidate.id; } );

    if( it == mEntries.end() ) {
      it = std::find_if(
        mEntries.begin(), mEntries.end(),
        [score]( const Entry& candidate ) { return score > candidate.score; } );
    }

    if( it != mEntries.end() ) {
      it->id    = id;
      it->score = score;

      mLowestScore =
        std::min_element( mEntries.begin(), mEntries.end() )->score;
    }
  }